

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reuse_async_url_session.hpp
# Opt level: O3

bool __thiscall
m2d::savanna::ssl_reuse::
reuse_async_request_executor<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>_>
::completion_callback
          (reuse_async_request_executor<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>_>
           *this,result<boost::beast::http::message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_>
                 *result)

{
  bool bVar1;
  byte bVar2;
  string_view sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> location;
  url new_url;
  undefined1 *local_298;
  long local_290;
  undefined1 local_288 [16];
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  url local_1d8;
  result<boost::beast::http::message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_>
  local_118;
  
  bVar1 = (result->response).super_type.m_initialized;
  bVar2 = (result->error).super_type.m_initialized;
  if ((bool)bVar2 == false) {
    if ((bVar1 & 1U) == 0) goto LAB_001192bf;
    if ((*(int *)((long)&(result->response).super_type.m_storage.dummy_ + 0x5c) - 300U < 100) &&
       (this->follow_location_ == true)) {
      sVar3.len_ = 8;
      sVar3.ptr_ = "Location";
      sVar3 = boost::beast::http::basic_fields<std::allocator<char>_>::operator[]
                        ((basic_fields<std::allocator<char>_> *)
                         &(result->response).super_type.m_storage,sVar3);
      local_298 = local_288;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_298,sVar3.ptr_,sVar3.ptr_ + sVar3.len_);
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_238,local_298,local_298 + local_290);
      url::url(&local_1d8,&local_238);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p);
      }
      url::to_string_abi_cxx11_(&local_1f8,&local_1d8);
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_258,local_1d8.host_._M_dataplus._M_p,
                 local_1d8.host_._M_dataplus._M_p + local_1d8.host_._M_string_length);
      update_request(this,&this->original_request_,&local_1f8,&local_258);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p);
      }
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_278,local_1d8.host_._M_dataplus._M_p,
                 local_1d8.host_._M_dataplus._M_p + local_1d8.host_._M_string_length);
      url::port_str_abi_cxx11_(&local_218,&local_1d8);
      run(this,&local_278,&local_218);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8.fragment_._M_dataplus._M_p != &local_1d8.fragment_.field_2) {
        operator_delete(local_1d8.fragment_._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8.query_._M_dataplus._M_p != &local_1d8.query_.field_2) {
        operator_delete(local_1d8.query_._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8.path_._M_dataplus._M_p != &local_1d8.path_.field_2) {
        operator_delete(local_1d8.path_._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8.port_._M_dataplus._M_p != &local_1d8.port_.field_2) {
        operator_delete(local_1d8.port_._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8.host_._M_dataplus._M_p != &local_1d8.host_.field_2) {
        operator_delete(local_1d8.host_._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8.scheme_._M_dataplus._M_p != &local_1d8.scheme_.field_2) {
        operator_delete(local_1d8.scheme_._M_dataplus._M_p);
      }
      if (local_298 != local_288) {
        operator_delete(local_298);
      }
      return false;
    }
LAB_00119225:
    local_118.response.super_type.m_initialized = false;
    boost::beast::http::
    message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
    ::message((message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
               *)&local_118.response.super_type.m_storage,
              (message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
               *)&(result->response).super_type.m_storage);
    local_118.response.super_type.m_initialized = true;
    bVar2 = (result->error).super_type.m_initialized;
  }
  else {
    local_118.response.super_type.m_initialized = false;
    if ((bVar1 & 1U) != 0) goto LAB_00119225;
  }
  local_118.error.super_type.m_initialized = false;
  if ((bVar2 & 1) != 0) {
    boost::optional_detail::optional_base<boost::system::system_error>::construct
              (&local_118.error.super_type,(argument_type)&(result->error).super_type.m_storage);
  }
  if ((this->completion_).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->completion_)._M_invoker)((_Any_data *)&this->completion_,&local_118);
    if (local_118.error.super_type.m_initialized == true) {
      boost::system::system_error::~system_error
                ((system_error *)&local_118.error.super_type.m_storage);
      local_118.error.super_type.m_initialized = false;
    }
    boost::optional_detail::
    optional_base<boost::beast::http::message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_>
    ::~optional_base((optional_base<boost::beast::http::message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_>
                      *)&local_118);
    return true;
  }
  std::__throw_bad_function_call();
LAB_001192bf:
  __assert_fail("this->is_initialized()","/usr/include/boost/optional/optional.hpp",0x4c6,
                "pointer_type boost::optional<boost::beast::http::message<false, boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>>>>>::operator->() [T = boost::beast::http::message<false, boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>>>>]"
               );
}

Assistant:

bool completion_callback(savanna::result<http::response<http::dynamic_body>> result) override {
			if (!result.error) {
				if ((result.response->result_int() >= 300) && result.response->result_int() < 400 && follow_location_) {
					auto location = result.response->base()["Location"].to_string();
					auto new_url = savanna::url(location);
					update_request(original_request_, new_url.to_string(), new_url.host());
					run(new_url.host(), new_url.port_str());
					return false;
				}
			}
			completion_(result);
			return true;
		}